

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_stdout_and_stderr_to_file(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  uv_process_options_t *puVar6;
  int extraout_EDX;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  ulong unaff_RBP;
  long *plVar10;
  long *plVar11;
  undefined1 **ppuVar12;
  uv_process_options_t *unaff_R14;
  undefined8 unaff_R15;
  int64_t eval_b_1;
  int64_t eval_b_5;
  int64_t eval_b;
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  undefined1 *puStack_d00;
  uv_process_options_t *puStack_cf8;
  undefined8 uStack_cf0;
  code *pcStack_ce8;
  long lStack_ce0;
  long lStack_cd8;
  uv_process_options_t *puStack_cd0;
  long lStack_cc0;
  long lStack_cb8;
  uv_process_options_t *puStack_cb0;
  uv_process_options_t *puStack_ca8;
  long lStack_c98;
  long lStack_c90;
  undefined4 uStack_c84;
  uv_stdio_container_t uStack_c80;
  undefined4 uStack_c70;
  undefined4 uStack_c68;
  undefined4 uStack_c60;
  undefined4 uStack_c58;
  undefined4 uStack_c50;
  undefined4 uStack_c48;
  undefined1 auStack_c40 [16];
  uv_process_options_t *puStack_c30;
  undefined8 uStack_c28;
  long lStack_c20;
  undefined1 auStack_c18 [208];
  code *pcStack_b48;
  long lStack_b40;
  long lStack_b38;
  uv_stdio_container_t uStack_b30;
  undefined4 uStack_b20;
  undefined4 uStack_b10;
  undefined4 uStack_b00;
  uv_process_options_t *puStack_af8;
  uv_process_options_t auStack_ae8 [2];
  undefined1 *puStack_a00;
  anon_union_8_2_13e1ed65_for_data aStack_9f8;
  code *pcStack_9f0;
  undefined8 uStack_9e0;
  code *pcStack_9d8;
  long lStack_9d0;
  long lStack_9c8;
  char *pcStack_9c0;
  undefined8 uStack_9b8;
  char acStack_9b0 [32];
  uv_stdio_container_t uStack_990;
  undefined4 uStack_980;
  undefined1 *puStack_978;
  long alStack_968 [25];
  undefined1 auStack_8a0 [232];
  undefined1 auStack_7b8 [232];
  char *pcStack_6d0;
  uv_process_options_t *puStack_6c8;
  code *pcStack_6c0;
  undefined8 uStack_6b8;
  long lStack_6a8;
  long lStack_6a0;
  undefined1 auStack_698 [16];
  uv_stdio_container_t uStack_688;
  undefined4 uStack_678;
  uint uStack_670;
  undefined4 uStack_668;
  uint uStack_660;
  uv_process_options_t uStack_650;
  uint uStack_5f8;
  char *pcStack_490;
  uv_process_options_t *puStack_488;
  undefined1 auStack_450 [16];
  uv_stdio_container_t uStack_440;
  undefined4 uStack_430;
  uint uStack_428;
  undefined4 uStack_420;
  uint uStack_418;
  uv_process_options_t uStack_410;
  int iStack_3b8;
  char *pcStack_250;
  uv_process_options_t *puStack_248;
  undefined1 local_218 [16];
  uv_stdio_container_t local_208;
  undefined4 local_1f8;
  uint local_1f0;
  undefined4 local_1e8;
  uint local_1e0;
  uv_process_options_t local_1d0;
  uint local_178;
  
  pcVar7 = "stdout_file";
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open(0,&local_1d0,"stdout_file",0x42,0x180,0);
  local_208._0_8_ = SEXT48(iVar1);
  local_218._0_8_ = 0;
  if (local_208._0_8_ == 0) {
    pcVar7 = (char *)(ulong)local_178;
    uv_fs_req_cleanup();
    options.stdio = &local_208;
    unaff_R14 = &options;
    local_208._0_8_ = local_208._0_8_ & 0xffffffff00000000;
    local_1f8 = 2;
    local_1f0 = local_178;
    local_1e8 = 2;
    local_1e0 = local_178;
    options.stdio_count = 3;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    local_218._0_8_ = SEXT48(iVar1);
    if (local_218._0_8_ != 0) goto LAB_001bf6bd;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    local_218._0_8_ = SEXT48(iVar1);
    if (local_218._0_8_ != 0) goto LAB_001bf6cc;
    local_218._0_8_ = 1;
    if (exit_cb_called != 1) goto LAB_001bf6db;
    local_218._0_8_ = 1;
    if (close_cb_called != 1) goto LAB_001bf6ea;
    local_218 = uv_buf_init(output,0x400);
    iVar1 = uv_fs_read(0,&local_1d0,pcVar7,local_218,1,0);
    if (iVar1 != 0x1b) goto LAB_001bf6f9;
    unaff_R14 = &local_1d0;
    uv_fs_req_cleanup(unaff_R14);
    iVar1 = uv_fs_close(0,unaff_R14,local_178,0);
    if (iVar1 != 0) goto LAB_001bf708;
    uv_fs_req_cleanup(&local_1d0);
    pcVar7 = output;
    printf("output is: %s",output);
    iVar1 = strcmp("hello world\nhello errworld\n",output);
    if (iVar1 != 0) goto LAB_001bf717;
    unlink("stdout_file");
    pcVar7 = (char *)uv_default_loop();
    uv_walk(pcVar7,close_walk_cb,0);
    uv_run(pcVar7,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_stdout_and_stderr_to_file_cold_1();
LAB_001bf6bd:
    run_test_spawn_stdout_and_stderr_to_file_cold_2();
LAB_001bf6cc:
    run_test_spawn_stdout_and_stderr_to_file_cold_3();
LAB_001bf6db:
    run_test_spawn_stdout_and_stderr_to_file_cold_4();
LAB_001bf6ea:
    run_test_spawn_stdout_and_stderr_to_file_cold_5();
LAB_001bf6f9:
    run_test_spawn_stdout_and_stderr_to_file_cold_6();
LAB_001bf708:
    run_test_spawn_stdout_and_stderr_to_file_cold_7();
LAB_001bf717:
    run_test_spawn_stdout_and_stderr_to_file_cold_8();
  }
  run_test_spawn_stdout_and_stderr_to_file_cold_9();
  pcVar8 = "stdout_file";
  pcStack_250 = pcVar7;
  puStack_248 = unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open(0,&uStack_410,"stdout_file",0x42,0x180,0);
  uStack_440._0_8_ = SEXT48(iVar1);
  auStack_450._0_8_ = 0;
  if (uStack_440._0_8_ == 0) {
    uv_fs_req_cleanup();
    unaff_RBP = 2;
    uVar2 = dup2(iStack_3b8,2);
    pcVar8 = (char *)(ulong)uVar2;
    uStack_440._0_8_ = SEXT48((int)uVar2);
    auStack_450._0_8_ = -1;
    if (uStack_440._0_8_ == -1) goto LAB_001bfa24;
    options.stdio = &uStack_440;
    unaff_R14 = &options;
    uStack_440._4_4_ = (int)uVar2 >> 0x1f;
    uStack_440._0_8_ = (ulong)(uint)uStack_440._4_4_ << 0x20;
    uStack_430 = 2;
    uStack_420 = 2;
    options.stdio_count = 3;
    uStack_428 = uVar2;
    uStack_418 = uVar2;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    auStack_450._0_8_ = SEXT48(iVar1);
    if (auStack_450._0_8_ != 0) goto LAB_001bfa33;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    auStack_450._0_8_ = SEXT48(iVar1);
    if (auStack_450._0_8_ != 0) goto LAB_001bfa42;
    auStack_450._0_8_ = 1;
    if (exit_cb_called != 1) goto LAB_001bfa51;
    auStack_450._0_8_ = 1;
    if (close_cb_called != 1) goto LAB_001bfa60;
    auStack_450 = uv_buf_init(output,0x400);
    iVar1 = uv_fs_read(0,&uStack_410,pcVar8,auStack_450,1,0);
    if (iVar1 != 0x1b) goto LAB_001bfa6f;
    unaff_R14 = &uStack_410;
    uv_fs_req_cleanup(unaff_R14);
    iVar1 = uv_fs_close(0,unaff_R14,uVar2,0);
    if (iVar1 != 0) goto LAB_001bfa7e;
    uv_fs_req_cleanup(&uStack_410);
    pcVar8 = output;
    printf("output is: %s",output);
    iVar1 = strcmp("hello world\nhello errworld\n",output);
    if (iVar1 != 0) goto LAB_001bfa8d;
    unlink("stdout_file");
    pcVar8 = (char *)uv_default_loop();
    uv_walk(pcVar8,close_walk_cb,0);
    uv_run(pcVar8,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_001bfa24:
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_001bfa33:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_001bfa42:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_001bfa51:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_001bfa60:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_001bfa6f:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_001bfa7e:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
LAB_001bfa8d:
    run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_9();
  pcVar7 = "stdout_file";
  pcStack_6c0 = (code *)0x1bfac7;
  pcStack_490 = pcVar8;
  puStack_488 = unaff_R14;
  unlink("stdout_file");
  pcStack_6c0 = (code *)0x1bfad3;
  unlink("stderr_file");
  pcStack_6c0 = (code *)0x1bfae6;
  init_process_options("spawn_helper6",exit_cb);
  pcStack_6c0 = (code *)0x1bfb03;
  iVar1 = uv_fs_open(0,&uStack_650,"stdout_file",0x42,0x180,0);
  uVar2 = uStack_5f8;
  uStack_688._0_8_ = SEXT48(iVar1);
  auStack_698._0_8_ = 0;
  if (uStack_688._0_8_ == 0) {
    pcVar7 = (char *)(ulong)uStack_5f8;
    pcStack_6c0 = (code *)0x1bfb30;
    uv_fs_req_cleanup();
    pcStack_6c0 = (code *)0x1bfb3c;
    uVar2 = dup2(uVar2,1);
    unaff_RBP = (ulong)uVar2;
    uStack_688._0_8_ = SEXT48((int)uVar2);
    auStack_698._0_8_ = -1;
    if (uStack_688._0_8_ == -1) goto LAB_001bff0f;
    pcStack_6c0 = (code *)0x1bfb7f;
    iVar1 = uv_fs_open(0,&uStack_650,"stderr_file",0x42,0x180,0);
    uStack_688._0_8_ = SEXT48(iVar1);
    auStack_698._0_8_ = 0;
    if (uStack_688._0_8_ != 0) goto LAB_001bff1e;
    pcStack_6c0 = (code *)0x1bfbac;
    uv_fs_req_cleanup();
    unaff_R15 = 2;
    pcStack_6c0 = (code *)0x1bfbbe;
    uVar3 = dup2(uStack_5f8,2);
    pcVar7 = (char *)(ulong)uVar3;
    uStack_688._0_8_ = SEXT48((int)uVar3);
    auStack_698._0_8_ = -1;
    if (uStack_688._0_8_ == -1) goto LAB_001bff2d;
    options.stdio = &uStack_688;
    unaff_R14 = &options;
    uStack_688._4_4_ = (int)uVar3 >> 0x1f;
    uStack_688._0_8_ = (ulong)(uint)uStack_688._4_4_ << 0x20;
    uStack_678 = 2;
    uStack_668 = 2;
    options.stdio_count = 3;
    pcStack_6c0 = (code *)0x1bfc16;
    uStack_670 = uVar3;
    uStack_660 = uVar2;
    uVar4 = uv_default_loop();
    pcStack_6c0 = (code *)0x1bfc28;
    iVar1 = uv_spawn(uVar4,&process,&options);
    auStack_698._0_8_ = SEXT48(iVar1);
    lStack_6a8 = 0;
    if (auStack_698._0_8_ != 0) goto LAB_001bff3c;
    pcStack_6c0 = (code *)0x1bfc4d;
    uVar4 = uv_default_loop();
    pcStack_6c0 = (code *)0x1bfc57;
    iVar1 = uv_run(uVar4,0);
    auStack_698._0_8_ = SEXT48(iVar1);
    lStack_6a8 = 0;
    if (auStack_698._0_8_ != 0) goto LAB_001bff4b;
    auStack_698._0_8_ = 1;
    lStack_6a8 = (long)exit_cb_called;
    if (lStack_6a8 != 1) goto LAB_001bff5a;
    auStack_698._0_8_ = 1;
    lStack_6a8 = (long)close_cb_called;
    if (lStack_6a8 != 1) goto LAB_001bff69;
    pcStack_6c0 = (code *)0x1bfcd2;
    auStack_698 = uv_buf_init(output,0x400);
    uStack_6b8 = 0;
    pcStack_6c0 = (code *)0x1bfcfd;
    iVar1 = uv_fs_read(0,&uStack_650,uVar2,auStack_698,1,0);
    lStack_6a8 = (long)iVar1;
    lStack_6a0 = 0xf;
    pcVar8 = (char *)unaff_R14;
    if (lStack_6a8 < 0xf) goto LAB_001bff78;
    pcVar8 = (char *)&uStack_650;
    pcStack_6c0 = (code *)0x1bfd2a;
    uv_fs_req_cleanup(pcVar8);
    pcStack_6c0 = (code *)0x1bfd38;
    iVar1 = uv_fs_close(0,pcVar8,unaff_RBP,0);
    lStack_6a8 = (long)iVar1;
    lStack_6a0 = 0;
    if (lStack_6a8 != 0) goto LAB_001bff87;
    pcStack_6c0 = (code *)0x1bfd62;
    uv_fs_req_cleanup(&uStack_650);
    pcVar8 = output;
    pcStack_6c0 = (code *)0x1bfd7a;
    printf("output is: %s",output);
    pcStack_6c0 = (code *)0x1bfd8e;
    iVar1 = strncmp("hello errworld\n",output,0xf);
    lStack_6a8 = (long)iVar1;
    lStack_6a0 = 0;
    if (lStack_6a8 != 0) goto LAB_001bff96;
    uStack_6b8 = 0;
    pcStack_6c0 = (code *)0x1bfdd2;
    iVar1 = uv_fs_read(0,&uStack_650,uVar3,auStack_698,1,0);
    lStack_6a8 = (long)iVar1;
    lStack_6a0 = 0xc;
    if (lStack_6a8 < 0xc) goto LAB_001bffa5;
    pcVar8 = (char *)&uStack_650;
    pcStack_6c0 = (code *)0x1bfdff;
    uv_fs_req_cleanup(pcVar8);
    pcStack_6c0 = (code *)0x1bfe0d;
    iVar1 = uv_fs_close(0,pcVar8,pcVar7,0);
    lStack_6a8 = (long)iVar1;
    lStack_6a0 = 0;
    if (lStack_6a8 != 0) goto LAB_001bffb4;
    pcStack_6c0 = (code *)0x1bfe37;
    uv_fs_req_cleanup(&uStack_650);
    pcVar7 = output;
    pcStack_6c0 = (code *)0x1bfe4f;
    printf("output is: %s",output);
    pcStack_6c0 = (code *)0x1bfe63;
    iVar1 = strncmp("hello world\n",output,0xc);
    lStack_6a8 = (long)iVar1;
    lStack_6a0 = 0;
    if (lStack_6a8 != 0) goto LAB_001bffc3;
    pcStack_6c0 = (code *)0x1bfe8f;
    unlink("stdout_file");
    pcStack_6c0 = (code *)0x1bfe9b;
    unlink("stderr_file");
    pcStack_6c0 = (code *)0x1bfea0;
    pcVar7 = (char *)uv_default_loop();
    pcStack_6c0 = (code *)0x1bfeb4;
    uv_walk(pcVar7,close_walk_cb,0);
    pcStack_6c0 = (code *)0x1bfebe;
    uv_run(pcVar7,0);
    lStack_6a8 = 0;
    pcStack_6c0 = (code *)0x1bfecc;
    uVar4 = uv_default_loop();
    pcStack_6c0 = (code *)0x1bfed4;
    iVar1 = uv_loop_close(uVar4);
    lStack_6a0 = (long)iVar1;
    if (lStack_6a8 == lStack_6a0) {
      pcStack_6c0 = (code *)0x1bfef0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_6c0 = (code *)0x1bff0f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_001bff0f:
    pcStack_6c0 = (code *)0x1bff1e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_001bff1e:
    pcStack_6c0 = (code *)0x1bff2d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_001bff2d:
    pcStack_6c0 = (code *)0x1bff3c;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_001bff3c:
    pcStack_6c0 = (code *)0x1bff4b;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_001bff4b:
    pcStack_6c0 = (code *)0x1bff5a;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_001bff5a:
    pcStack_6c0 = (code *)0x1bff69;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_001bff69:
    pcStack_6c0 = (code *)0x1bff78;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
    pcVar8 = (char *)unaff_R14;
LAB_001bff78:
    pcStack_6c0 = (code *)0x1bff87;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_001bff87:
    pcStack_6c0 = (code *)0x1bff96;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_001bff96:
    pcStack_6c0 = (code *)0x1bffa5;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_001bffa5:
    pcStack_6c0 = (code *)0x1bffb4;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_001bffb4:
    pcStack_6c0 = (code *)0x1bffc3;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_001bffc3:
    pcStack_6c0 = (code *)0x1bffd2;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  pcStack_6c0 = run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  iVar9 = (int)&lStack_9d0;
  builtin_strncpy(acStack_9b0,"hello-from-spawn_stdin",0x17);
  pcStack_9d8 = (code *)0x1c001b;
  pcStack_6d0 = pcVar7;
  puStack_6c8 = (uv_process_options_t *)pcVar8;
  pcStack_6c0 = (code *)unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  pcStack_9d8 = (code *)0x1c0020;
  uVar4 = uv_default_loop();
  puVar5 = auStack_7b8;
  pcStack_9d8 = (code *)0x1c0035;
  uv_pipe_init(uVar4,puVar5,0);
  pcStack_9d8 = (code *)0x1c003a;
  uVar4 = uv_default_loop();
  pcStack_9d8 = (code *)0x1c004f;
  uv_pipe_init(uVar4,(uv_stream_t *)auStack_8a0,0);
  options.stdio = &uStack_990;
  uStack_990.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStack_980 = 0x21;
  options.stdio_count = 2;
  pcStack_9d8 = (code *)0x1c0086;
  uStack_990.data.stream = (uv_stream_t *)auStack_8a0;
  puStack_978 = puVar5;
  uVar4 = uv_default_loop();
  pcStack_9d8 = (code *)0x1c0098;
  iVar1 = uv_spawn(uVar4,&process,&options);
  alStack_968[0] = (long)iVar1;
  pcStack_9c0 = (char *)0x0;
  if (alStack_968[0] == 0) {
    pcStack_9c0 = acStack_9b0;
    uStack_9b8 = 0x17;
    pcStack_9d8 = (code *)0x1c00eb;
    iVar1 = uv_write(alStack_968,auStack_8a0,&pcStack_9c0,1,write_cb);
    lStack_9c8 = (long)iVar1;
    lStack_9d0 = 0;
    if (lStack_9c8 != 0) goto LAB_001c0251;
    pcStack_9d8 = (code *)0x1c0124;
    iVar1 = uv_read_start(auStack_7b8,on_alloc,on_read);
    lStack_9c8 = (long)iVar1;
    lStack_9d0 = 0;
    if (lStack_9c8 != 0) goto LAB_001c025e;
    pcStack_9d8 = (code *)0x1c0147;
    uVar4 = uv_default_loop();
    pcStack_9d8 = (code *)0x1c0151;
    iVar1 = uv_run(uVar4,0);
    lStack_9c8 = (long)iVar1;
    lStack_9d0 = 0;
    if (lStack_9c8 != 0) goto LAB_001c026b;
    lStack_9c8 = 1;
    lStack_9d0 = (long)exit_cb_called;
    if (lStack_9d0 != 1) goto LAB_001c0278;
    lStack_9c8 = 3;
    lStack_9d0 = (long)close_cb_called;
    if (lStack_9d0 != 3) goto LAB_001c0285;
    pcStack_9d8 = (code *)0x1c01c6;
    iVar1 = strcmp(acStack_9b0,output);
    lStack_9c8 = (long)iVar1;
    lStack_9d0 = 0;
    if (lStack_9c8 != 0) goto LAB_001c0292;
    pcStack_9d8 = (code *)0x1c01e9;
    puVar5 = (undefined1 *)uv_default_loop();
    pcStack_9d8 = (code *)0x1c01fd;
    uv_walk(puVar5,close_walk_cb,0);
    pcStack_9d8 = (code *)0x1c0207;
    uv_run(puVar5,0);
    lStack_9c8 = 0;
    pcStack_9d8 = (code *)0x1c0215;
    uVar4 = uv_default_loop();
    pcStack_9d8 = (code *)0x1c021d;
    iVar1 = uv_loop_close(uVar4);
    lStack_9d0 = (long)iVar1;
    if (lStack_9c8 == lStack_9d0) {
      pcStack_9d8 = (code *)0x1c0233;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_9d8 = (code *)0x1c0251;
    run_test_spawn_stdin_cold_1();
LAB_001c0251:
    pcStack_9d8 = (code *)0x1c025e;
    run_test_spawn_stdin_cold_2();
LAB_001c025e:
    pcStack_9d8 = (code *)0x1c026b;
    run_test_spawn_stdin_cold_3();
LAB_001c026b:
    pcStack_9d8 = (code *)0x1c0278;
    run_test_spawn_stdin_cold_4();
LAB_001c0278:
    pcStack_9d8 = (code *)0x1c0285;
    run_test_spawn_stdin_cold_5();
LAB_001c0285:
    pcStack_9d8 = (code *)0x1c0292;
    run_test_spawn_stdin_cold_6();
LAB_001c0292:
    pcStack_9d8 = (code *)0x1c029f;
    run_test_spawn_stdin_cold_7();
  }
  plVar10 = &lStack_9c8;
  pcStack_9d8 = write_cb;
  run_test_spawn_stdin_cold_8();
  pcStack_9d8 = (code *)(long)iVar9;
  uStack_9e0 = 0;
  if (pcStack_9d8 == (code *)0x0) {
    iVar1 = uv_close(plVar10[0xb],close_cb);
    return iVar1;
  }
  pcStack_9f0 = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  pcStack_b48 = (code *)0x1c030e;
  puStack_a00 = puVar5;
  aStack_9f8.stream = (uv_stream_t *)auStack_8a0;
  pcStack_9f0 = (code *)unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  pcStack_b48 = (code *)0x1c0313;
  uVar4 = uv_default_loop();
  puVar6 = auStack_ae8;
  pcStack_b48 = (code *)0x1c0327;
  uv_pipe_init(uVar4,puVar6,0);
  options.stdio = &uStack_b30;
  uStack_b30.flags = UV_IGNORE;
  uStack_b20 = 0;
  uStack_b10 = 0;
  uStack_b00 = 0x21;
  options.stdio_count = 4;
  pcStack_b48 = (code *)0x1c035c;
  puStack_af8 = puVar6;
  uVar4 = uv_default_loop();
  pcStack_b48 = (code *)0x1c036e;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_b38 = (long)iVar1;
  lStack_b40 = 0;
  if (lStack_b38 == 0) {
    pcStack_b48 = (code *)0x1c03a4;
    iVar1 = uv_read_start(auStack_ae8,on_alloc,on_read);
    lStack_b38 = (long)iVar1;
    lStack_b40 = 0;
    if (lStack_b38 != 0) goto LAB_001c04e4;
    pcStack_b48 = (code *)0x1c03c7;
    uVar4 = uv_default_loop();
    pcStack_b48 = (code *)0x1c03d1;
    iVar1 = uv_run(uVar4,0);
    lStack_b38 = (long)iVar1;
    lStack_b40 = 0;
    if (lStack_b38 != 0) goto LAB_001c04f1;
    lStack_b38 = 1;
    lStack_b40 = (long)exit_cb_called;
    if (lStack_b40 != 1) goto LAB_001c04fe;
    lStack_b38 = 2;
    lStack_b40 = (long)close_cb_called;
    if (lStack_b40 != 2) goto LAB_001c050b;
    pcStack_b48 = (code *)0x1c044d;
    printf("output from stdio[3] is: %s",output);
    pcStack_b48 = (code *)0x1c045c;
    iVar1 = strcmp("fourth stdio!\n",output);
    lStack_b38 = (long)iVar1;
    lStack_b40 = 0;
    puVar6 = (uv_process_options_t *)output;
    if (lStack_b38 != 0) goto LAB_001c0518;
    pcStack_b48 = (code *)0x1c047f;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    pcStack_b48 = (code *)0x1c0493;
    uv_walk(puVar6,close_walk_cb,0);
    pcStack_b48 = (code *)0x1c049d;
    uv_run(puVar6,0);
    lStack_b38 = 0;
    pcStack_b48 = (code *)0x1c04ab;
    uVar4 = uv_default_loop();
    pcStack_b48 = (code *)0x1c04b3;
    iVar1 = uv_loop_close(uVar4);
    lStack_b40 = (long)iVar1;
    if (lStack_b38 == lStack_b40) {
      pcStack_b48 = (code *)0x1c04c9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_b48 = (code *)0x1c04e4;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_001c04e4:
    pcStack_b48 = (code *)0x1c04f1;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_001c04f1:
    pcStack_b48 = (code *)0x1c04fe;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_001c04fe:
    pcStack_b48 = (code *)0x1c050b;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_001c050b:
    pcStack_b48 = (code *)0x1c0518;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_001c0518:
    pcStack_b48 = (code *)0x1c0525;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  pcStack_b48 = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStack_c30 = (uv_process_options_t *)0x1c053e;
  uVar4 = uv_default_loop();
  puStack_c30 = (uv_process_options_t *)0x1c054b;
  iVar1 = uv_tcp_init(uVar4,auStack_c18);
  lStack_c20 = (long)iVar1;
  uStack_c28 = 0;
  if (lStack_c20 == 0) {
    puStack_c30 = (uv_process_options_t *)0x1c0574;
    iVar1 = uv_tcp_open(auStack_c18,3);
    lStack_c20 = (long)iVar1;
    uStack_c28 = 0;
    if (lStack_c20 != 0) goto LAB_001c05d3;
    puStack_c30 = (uv_process_options_t *)0x1c059f;
    iVar1 = uv_listen(auStack_c18,0x1000,0);
    lStack_c20 = (long)iVar1;
    uStack_c28 = 0;
    if (lStack_c20 == 0) {
      return 1;
    }
  }
  else {
    puStack_c30 = (uv_process_options_t *)0x1c05d3;
    spawn_tcp_server_helper_cold_1();
LAB_001c05d3:
    puStack_c30 = (uv_process_options_t *)0x1c05e0;
    spawn_tcp_server_helper_cold_2();
  }
  puStack_c30 = (uv_process_options_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStack_ca8 = (uv_process_options_t *)0x1c0605;
  puStack_c30 = puVar6;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  puStack_ca8 = (uv_process_options_t *)0x1c061b;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_c40);
  uStack_c80._0_8_ = SEXT48(iVar1);
  lStack_c98 = 0;
  if (uStack_c80._0_8_ == 0) {
    puStack_ca8 = (uv_process_options_t *)0x1c0640;
    uVar4 = uv_default_loop();
    puStack_ca8 = (uv_process_options_t *)0x1c0654;
    iVar1 = uv_tcp_init_ex(uVar4,&tcp_server,2);
    uStack_c80._0_8_ = SEXT48(iVar1);
    lStack_c98 = 0;
    if (uStack_c80._0_8_ != 0) goto LAB_001c0839;
    puStack_ca8 = (uv_process_options_t *)0x1c0687;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_c40,0);
    uStack_c80._0_8_ = SEXT48(iVar1);
    lStack_c98 = 0;
    if (uStack_c80._0_8_ != 0) goto LAB_001c0848;
    puStack_ca8 = (uv_process_options_t *)0x1c06b8;
    iVar1 = uv_fileno(&tcp_server,&uStack_c84);
    uStack_c80._0_8_ = SEXT48(iVar1);
    lStack_c98 = 0;
    if (uStack_c80._0_8_ != 0) goto LAB_001c0857;
    options.stdio = &uStack_c80;
    puVar6 = &options;
    uStack_c80._4_4_ = iVar1 >> 0x1f;
    uStack_c80.flags = 2;
    uStack_c80.data.file = 0;
    uStack_c70 = 2;
    uStack_c68 = 1;
    uStack_c60 = 2;
    uStack_c58 = 2;
    uStack_c50 = 2;
    uStack_c48 = uStack_c84;
    options.stdio_count = 4;
    puStack_ca8 = (uv_process_options_t *)0x1c0722;
    uVar4 = uv_default_loop();
    puStack_ca8 = (uv_process_options_t *)0x1c0734;
    iVar1 = uv_spawn(uVar4,&process,&options);
    lStack_c98 = (long)iVar1;
    lStack_c90 = 0;
    if (lStack_c98 != 0) goto LAB_001c0866;
    puStack_ca8 = (uv_process_options_t *)0x1c0759;
    uVar4 = uv_default_loop();
    puStack_ca8 = (uv_process_options_t *)0x1c0763;
    iVar1 = uv_run(uVar4,0);
    lStack_c98 = (long)iVar1;
    lStack_c90 = 0;
    if (lStack_c98 != 0) goto LAB_001c0875;
    lStack_c98 = 1;
    lStack_c90 = (long)exit_cb_called;
    if (lStack_c90 != 1) goto LAB_001c0884;
    lStack_c98 = 1;
    lStack_c90 = (long)close_cb_called;
    if (lStack_c90 != 1) goto LAB_001c0893;
    puStack_ca8 = (uv_process_options_t *)0x1c07d2;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    puStack_ca8 = (uv_process_options_t *)0x1c07e6;
    uv_walk(puVar6,close_walk_cb,0);
    puStack_ca8 = (uv_process_options_t *)0x1c07f0;
    uv_run(puVar6,0);
    lStack_c98 = 0;
    puStack_ca8 = (uv_process_options_t *)0x1c07fe;
    uVar4 = uv_default_loop();
    puStack_ca8 = (uv_process_options_t *)0x1c0806;
    iVar1 = uv_loop_close(uVar4);
    lStack_c90 = (long)iVar1;
    if (lStack_c98 == lStack_c90) {
      puStack_ca8 = (uv_process_options_t *)0x1c0822;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_ca8 = (uv_process_options_t *)0x1c0839;
    run_test_spawn_tcp_server_cold_1();
LAB_001c0839:
    puStack_ca8 = (uv_process_options_t *)0x1c0848;
    run_test_spawn_tcp_server_cold_2();
LAB_001c0848:
    puStack_ca8 = (uv_process_options_t *)0x1c0857;
    run_test_spawn_tcp_server_cold_3();
LAB_001c0857:
    puStack_ca8 = (uv_process_options_t *)0x1c0866;
    run_test_spawn_tcp_server_cold_4();
LAB_001c0866:
    puStack_ca8 = (uv_process_options_t *)0x1c0875;
    run_test_spawn_tcp_server_cold_5();
LAB_001c0875:
    puStack_ca8 = (uv_process_options_t *)0x1c0884;
    run_test_spawn_tcp_server_cold_6();
LAB_001c0884:
    puStack_ca8 = (uv_process_options_t *)0x1c0893;
    run_test_spawn_tcp_server_cold_7();
LAB_001c0893:
    puStack_ca8 = (uv_process_options_t *)0x1c08a2;
    run_test_spawn_tcp_server_cold_8();
  }
  puStack_ca8 = (uv_process_options_t *)run_test_spawn_ignored_stdio;
  run_test_spawn_tcp_server_cold_9();
  puStack_ca8 = &options;
  puStack_cd0 = (uv_process_options_t *)0x1c08cb;
  puStack_cb0 = puVar6;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  puVar6 = &options;
  options.stdio_count = 0;
  puStack_cd0 = (uv_process_options_t *)0x1c08eb;
  uVar4 = uv_default_loop();
  puStack_cd0 = (uv_process_options_t *)0x1c08fd;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_cb8 = (long)iVar1;
  lStack_cc0 = 0;
  if (lStack_cb8 == 0) {
    puStack_cd0 = (uv_process_options_t *)0x1c091e;
    uVar4 = uv_default_loop();
    puStack_cd0 = (uv_process_options_t *)0x1c0928;
    iVar1 = uv_run(uVar4,0);
    lStack_cb8 = (long)iVar1;
    lStack_cc0 = 0;
    if (lStack_cb8 != 0) goto LAB_001c09fc;
    lStack_cb8 = 1;
    lStack_cc0 = (long)exit_cb_called;
    if (lStack_cc0 != 1) goto LAB_001c0a0b;
    lStack_cb8 = 1;
    lStack_cc0 = (long)close_cb_called;
    if (lStack_cc0 != 1) goto LAB_001c0a1a;
    puStack_cd0 = (uv_process_options_t *)0x1c0997;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    puStack_cd0 = (uv_process_options_t *)0x1c09ab;
    uv_walk(puVar6,close_walk_cb,0);
    puStack_cd0 = (uv_process_options_t *)0x1c09b5;
    uv_run(puVar6,0);
    lStack_cb8 = 0;
    puStack_cd0 = (uv_process_options_t *)0x1c09c3;
    uVar4 = uv_default_loop();
    puStack_cd0 = (uv_process_options_t *)0x1c09cb;
    iVar1 = uv_loop_close(uVar4);
    lStack_cc0 = (long)iVar1;
    if (lStack_cb8 == lStack_cc0) {
      puStack_cd0 = (uv_process_options_t *)0x1c09e3;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_cd0 = (uv_process_options_t *)0x1c09fc;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001c09fc:
    puStack_cd0 = (uv_process_options_t *)0x1c0a0b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001c0a0b:
    puStack_cd0 = (uv_process_options_t *)0x1c0a1a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001c0a1a:
    puStack_cd0 = (uv_process_options_t *)0x1c0a29;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStack_cd0 = (uv_process_options_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  plVar10 = &lStack_ce0;
  pcStack_ce8 = (code *)0x1c0a50;
  puStack_cd0 = puVar6;
  init_process_options("spawn_helper4",kill_cb);
  pcStack_ce8 = (code *)0x1c0a55;
  uVar4 = uv_default_loop();
  pcStack_ce8 = (code *)0x1c0a6b;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_cd8 = (long)iVar1;
  lStack_ce0 = 0;
  if (lStack_cd8 == 0) {
    pcStack_ce8 = (code *)0x1c0a8e;
    uVar4 = uv_default_loop();
    pcStack_ce8 = (code *)0x1c0a9d;
    iVar1 = uv_timer_init(uVar4,&timer);
    lStack_cd8 = (long)iVar1;
    lStack_ce0 = 0;
    if (lStack_cd8 != 0) goto LAB_001c0bca;
    pcStack_ce8 = (code *)0x1c0ad5;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    lStack_cd8 = (long)iVar1;
    lStack_ce0 = 0;
    if (lStack_cd8 != 0) goto LAB_001c0bd7;
    pcStack_ce8 = (code *)0x1c0af8;
    uVar4 = uv_default_loop();
    pcStack_ce8 = (code *)0x1c0b02;
    iVar1 = uv_run(uVar4,0);
    lStack_cd8 = (long)iVar1;
    lStack_ce0 = 0;
    if (lStack_cd8 != 0) goto LAB_001c0be4;
    lStack_cd8 = 1;
    lStack_ce0 = (long)exit_cb_called;
    if (lStack_ce0 != 1) goto LAB_001c0bf1;
    lStack_cd8 = 2;
    lStack_ce0 = (long)close_cb_called;
    if (lStack_ce0 != 2) goto LAB_001c0bfe;
    pcStack_ce8 = (code *)0x1c0b6b;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    pcStack_ce8 = (code *)0x1c0b7f;
    uv_walk(puVar6,close_walk_cb,0);
    pcStack_ce8 = (code *)0x1c0b89;
    uv_run(puVar6,0);
    lStack_cd8 = 0;
    pcStack_ce8 = (code *)0x1c0b97;
    uVar4 = uv_default_loop();
    pcStack_ce8 = (code *)0x1c0b9f;
    iVar1 = uv_loop_close(uVar4);
    lStack_ce0 = (long)iVar1;
    if (lStack_cd8 == lStack_ce0) {
      pcStack_ce8 = (code *)0x1c0bb5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_ce8 = (code *)0x1c0bca;
    run_test_spawn_and_kill_cold_1();
LAB_001c0bca:
    pcStack_ce8 = (code *)0x1c0bd7;
    run_test_spawn_and_kill_cold_2();
LAB_001c0bd7:
    pcStack_ce8 = (code *)0x1c0be4;
    run_test_spawn_and_kill_cold_3();
LAB_001c0be4:
    pcStack_ce8 = (code *)0x1c0bf1;
    run_test_spawn_and_kill_cold_4();
LAB_001c0bf1:
    pcStack_ce8 = (code *)0x1c0bfe;
    run_test_spawn_and_kill_cold_5();
LAB_001c0bfe:
    pcStack_ce8 = (code *)0x1c0c0b;
    run_test_spawn_and_kill_cold_6();
  }
  plVar11 = &lStack_cd8;
  pcStack_ce8 = kill_cb;
  run_test_spawn_and_kill_cold_7();
  pcStack_ce8 = (code *)0x0;
  uStack_cf0 = 0;
  puStack_cf8 = puVar6;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  puStack_d00 = (undefined1 *)plVar10;
  if (plVar10 == (long *)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001c0cb9;
    uv_close(plVar11,close_cb);
    puStack_d00 = (undefined1 *)(long)(int)plVar11[9];
    if (puStack_d00 != (undefined1 *)0x0) {
      iVar1 = uv_kill(puStack_d00,0);
      puStack_d00 = (undefined1 *)(long)iVar1;
      if (puStack_d00 == (undefined1 *)0xfffffffffffffffd) {
        return iVar1;
      }
      goto LAB_001c0ccb;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001c0cb9:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001c0ccb:
  ppuVar12 = &puStack_d00;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  iVar1 = uv_close(ppuVar12,close_cb);
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file) {
  int r;
  uv_os_fd_t file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper6", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", UV_FS_O_CREAT | UV_FS_O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.file = file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT_EQ(27, r);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strcmp("hello world\nhello errworld\n", output));

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}